

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts3PromoteSegments(Fts3Table *p,sqlite3_int64 iAbsLevel,sqlite3_int64 nByte)

{
  sqlite3_stmt *psVar1;
  int iVar2;
  Mem *pMVar3;
  i64 iVar4;
  long iValue;
  ulong uVar5;
  i64 nSize;
  i64 dummy;
  sqlite3_stmt *pRange;
  sqlite3_stmt *local_48;
  sqlite3_stmt *local_40;
  sqlite3_stmt *local_38;
  
  iVar2 = fts3SqlStmt(p,0x25,&local_38,(sqlite3_value **)0x0);
  if (iVar2 == 0) {
    uVar5 = iAbsLevel + 0x3ff;
    if (-1 < iAbsLevel) {
      uVar5 = iAbsLevel;
    }
    sqlite3_bind_int64(local_38,1,iAbsLevel + 1);
    sqlite3_bind_int64(local_38,2,uVar5 | 0x3ff);
    iVar2 = sqlite3_step(local_38);
    if (iVar2 != 100) {
LAB_001c25d8:
      iVar2 = sqlite3_reset(local_38);
      return iVar2;
    }
    do {
      local_48 = (sqlite3_stmt *)0x0;
      fts3ReadEndBlockField(local_38,2,(i64 *)&local_40,(i64 *)&local_48);
      if (((long)local_48 < 1) || ((nByte * 3) / 2 < (long)local_48)) goto LAB_001c25d8;
      iVar2 = sqlite3_step(local_38);
    } while (iVar2 == 100);
    iVar2 = sqlite3_reset(local_38);
    local_48 = (sqlite3_stmt *)0x0;
    local_40 = (sqlite3_stmt *)0x0;
    if (((iVar2 == 0) && (iVar2 = fts3SqlStmt(p,0x26,&local_48,(sqlite3_value **)0x0), iVar2 == 0))
       && (iVar2 = fts3SqlStmt(p,0x27,&local_40,(sqlite3_value **)0x0), iVar2 == 0)) {
      sqlite3_bind_int64(local_38,1,iAbsLevel);
      psVar1 = local_48;
      iValue = 0;
      do {
        iVar2 = sqlite3_step(local_38);
        if (iVar2 != 100) {
          iVar2 = sqlite3_reset(local_38);
          psVar1 = local_40;
          if (iVar2 != 0) {
            return iVar2;
          }
          sqlite3_bind_int64(local_40,1,iAbsLevel);
          sqlite3_step(psVar1);
          iVar2 = sqlite3_reset(psVar1);
          return iVar2;
        }
        sqlite3_bind_int64(psVar1,1,iValue);
        pMVar3 = columnMem(local_38,0);
        iVar4 = sqlite3VdbeIntValue(pMVar3);
        columnMallocFailure(local_38);
        sqlite3_bind_int64(psVar1,2,(long)(int)iVar4);
        pMVar3 = columnMem(local_38,1);
        iVar4 = sqlite3VdbeIntValue(pMVar3);
        columnMallocFailure(local_38);
        sqlite3_bind_int64(psVar1,3,(long)(int)iVar4);
        sqlite3_step(psVar1);
        iVar2 = sqlite3_reset(psVar1);
        iValue = iValue + 1;
      } while (iVar2 == 0);
      sqlite3_reset(local_38);
    }
  }
  return iVar2;
}

Assistant:

static int fts3PromoteSegments(
  Fts3Table *p,                   /* FTS table handle */
  sqlite3_int64 iAbsLevel,        /* Absolute level just updated */
  sqlite3_int64 nByte             /* Size of new segment at iAbsLevel */
){
  int rc = SQLITE_OK;
  sqlite3_stmt *pRange;

  rc = fts3SqlStmt(p, SQL_SELECT_LEVEL_RANGE2, &pRange, 0);

  if( rc==SQLITE_OK ){
    int bOk = 0;
    i64 iLast = (iAbsLevel/FTS3_SEGDIR_MAXLEVEL + 1) * FTS3_SEGDIR_MAXLEVEL - 1;
    i64 nLimit = (nByte*3)/2;

    /* Loop through all entries in the %_segdir table corresponding to 
    ** segments in this index on levels greater than iAbsLevel. If there is
    ** at least one such segment, and it is possible to determine that all 
    ** such segments are smaller than nLimit bytes in size, they will be 
    ** promoted to level iAbsLevel.  */
    sqlite3_bind_int64(pRange, 1, iAbsLevel+1);
    sqlite3_bind_int64(pRange, 2, iLast);
    while( SQLITE_ROW==sqlite3_step(pRange) ){
      i64 nSize = 0, dummy;
      fts3ReadEndBlockField(pRange, 2, &dummy, &nSize);
      if( nSize<=0 || nSize>nLimit ){
        /* If nSize==0, then the %_segdir.end_block field does not not 
        ** contain a size value. This happens if it was written by an
        ** old version of FTS. In this case it is not possible to determine
        ** the size of the segment, and so segment promotion does not
        ** take place.  */
        bOk = 0;
        break;
      }
      bOk = 1;
    }
    rc = sqlite3_reset(pRange);

    if( bOk ){
      int iIdx = 0;
      sqlite3_stmt *pUpdate1 = 0;
      sqlite3_stmt *pUpdate2 = 0;

      if( rc==SQLITE_OK ){
        rc = fts3SqlStmt(p, SQL_UPDATE_LEVEL_IDX, &pUpdate1, 0);
      }
      if( rc==SQLITE_OK ){
        rc = fts3SqlStmt(p, SQL_UPDATE_LEVEL, &pUpdate2, 0);
      }

      if( rc==SQLITE_OK ){

        /* Loop through all %_segdir entries for segments in this index with
        ** levels equal to or greater than iAbsLevel. As each entry is visited,
        ** updated it to set (level = -1) and (idx = N), where N is 0 for the
        ** oldest segment in the range, 1 for the next oldest, and so on.
        **
        ** In other words, move all segments being promoted to level -1,
        ** setting the "idx" fields as appropriate to keep them in the same
        ** order. The contents of level -1 (which is never used, except
        ** transiently here), will be moved back to level iAbsLevel below.  */
        sqlite3_bind_int64(pRange, 1, iAbsLevel);
        while( SQLITE_ROW==sqlite3_step(pRange) ){
          sqlite3_bind_int(pUpdate1, 1, iIdx++);
          sqlite3_bind_int(pUpdate1, 2, sqlite3_column_int(pRange, 0));
          sqlite3_bind_int(pUpdate1, 3, sqlite3_column_int(pRange, 1));
          sqlite3_step(pUpdate1);
          rc = sqlite3_reset(pUpdate1);
          if( rc!=SQLITE_OK ){
            sqlite3_reset(pRange);
            break;
          }
        }
      }
      if( rc==SQLITE_OK ){
        rc = sqlite3_reset(pRange);
      }

      /* Move level -1 to level iAbsLevel */
      if( rc==SQLITE_OK ){
        sqlite3_bind_int64(pUpdate2, 1, iAbsLevel);
        sqlite3_step(pUpdate2);
        rc = sqlite3_reset(pUpdate2);
      }
    }
  }


  return rc;
}